

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O2

size_t qHash(QLatin1StringView key,size_t seed)

{
  uint64_t len;
  size_t sVar1;
  ulong uVar2;
  ulong __n;
  uchar *__first;
  unsigned_long __n_00;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  array<char16_t,_256UL> buf;
  SipHash64<1,_2> local_270;
  undefined1 *local_238 [64];
  long local_38;
  
  __n = key.m_size;
  __first = (uchar *)key.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  len = __n * 2;
  if (__n < 5) {
    local_238[0] = &DAT_aaaaaaaaaaaaaaaa;
    std::copy_n<unsigned_char_const*,unsigned_long,char16_t*>(__first,__n,(char16_t *)local_238);
    sVar1 = murmurhash(local_238,len,0);
  }
  else {
    memset(local_238,0xaa,0x200);
    local_270.b = __n << 0x39;
    local_270.v2 = 0x6c7967656e657261;
    local_270.k0 = 0;
    local_270.v3 = len ^ 0x7465646279746573;
    local_270.v1 = len ^ 0x646f72616e646f6d;
    local_270.v0 = 0x736f6d6570736575;
    uVar2 = 0;
    uVar3 = __n;
    local_270.k1 = len;
    while (uVar2 + 0x100 < __n) {
      qt_from_latin1((char16_t *)local_238,(char *)(__first + uVar2),0x100);
      anon_unknown.dwarf_583ff1::SipHash64<1,_2>::addBlock(&local_270,(uint8_t *)local_238,0x200);
      uVar3 = uVar3 - 0x100;
      uVar2 = uVar2 + 0x100;
    }
    __n_00 = __n - uVar2;
    uVar4 = uVar2;
    if (3 < __n_00) {
      qt_from_latin1((char16_t *)local_238,(char *)(__first + uVar2),__n_00 & 0xfffffffffffffffc);
      anon_unknown.dwarf_583ff1::SipHash64<1,_2>::addBlock
                (&local_270,(uint8_t *)local_238,(__n_00 & 0xfffffffffffffffc) * 2);
      uVar4 = (uVar3 & 0xfffffffffffffffc) + uVar2;
      __n_00 = (__n - (uVar3 & 0xfffffffffffffffc)) - uVar2;
    }
    std::copy_n<unsigned_char_const*,unsigned_long,char16_t*>
              (__first + uVar4,__n_00,(char16_t *)local_238);
    sVar1 = anon_unknown.dwarf_583ff1::SipHash64<1,_2>::finalize
                      (&local_270,(uint8_t *)local_238,__n_00 * 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(QLatin1StringView key, size_t seed) noexcept
{
#ifdef QT_BOOTSTRAPPED
    // the seed is always 0 in bootstrapped mode (no seed generation code),
    // so help the compiler do dead code elimination
    seed = 0;
#endif

    auto data = reinterpret_cast<const uchar *>(key.data());
    size_t size = key.size();

    // Mix in the length as a secondary seed.
    // Multiplied by 2 to match the byte size of the equiavlent UTF-16 string.
    size_t seed2 = size * 2;
    if (seed)
        seed2 = qt_qhash_seed.currentSeed(1);

#if defined(AESHASH)
    if (seed && qCpuHasFeature(AES) && qCpuHasFeature(SSE4_2))
        return aeshash<ByteToWord>(data, size, seed, seed2);
#endif
    return qHashBits_fallback<ByteToWord>(data, size, seed, seed2);
}